

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O1

void __thiscall Movegen::generate<(Movetype)10,(Piece)6>(Movegen *this)

{
  Square *pSVar1;
  Color CVar2;
  long lVar3;
  U8 UVar4;
  U64 UVar5;
  ulong uVar6;
  U64 UVar7;
  Square *pSVar8;
  int iVar9;
  uint uVar10;
  code *pcVar11;
  Square SVar12;
  U8 UVar13;
  ulong uVar14;
  U8 *pUVar15;
  U64 mvs;
  ulong local_30;
  
  uVar6 = this->check_target;
  if (uVar6 == 0) {
    local_30 = 0;
    if (this->pawns7 != 0) {
      pcVar11 = anon_unknown.dwarf_96d6f::shift<(Dir)1>;
      if (this->us == white) {
        pcVar11 = anon_unknown.dwarf_96d6f::shift<(Dir)0>;
      }
      local_30 = this->pawns7;
      (*pcVar11)(&local_30);
      local_30 = local_30 & this->qtarget;
    }
    if (local_30 != 0) {
      CVar2 = this->us;
      uVar6 = (ulong)this->last;
      pUVar15 = &this->list[uVar6 + 3].type;
      do {
        lVar3 = 0;
        if (local_30 != 0) {
          for (; (local_30 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        UVar4 = (U8)lVar3;
        UVar13 = (CVar2 != white) * '\x10' + -8 + UVar4;
        uVar10 = (int)uVar6 + 4;
        uVar6 = (ulong)uVar10;
        pUVar15[-0xb] = UVar13;
        pUVar15[-10] = UVar4;
        pUVar15[-9] = 0;
        pUVar15[-8] = UVar13;
        pUVar15[-7] = UVar4;
        pUVar15[-6] = 1;
        pUVar15[-5] = UVar13;
        pUVar15[-4] = UVar4;
        pUVar15[-3] = 2;
        ((Move *)(pUVar15 + -2))->f = UVar13;
        pUVar15[-1] = UVar4;
        *pUVar15 = '\x03';
        pUVar15 = pUVar15 + 0xc;
        local_30 = local_30 - 1 & local_30;
      } while (local_30 != 0);
      this->last = uVar10;
      local_30 = 0;
    }
    pSVar8 = this->knights;
    SVar12 = *pSVar8;
    if (SVar12 != no_square) {
      iVar9 = this->last;
      uVar6 = this->qtarget;
      do {
        uVar14 = (&bitboards::nmask)[SVar12] & uVar6;
        if (uVar14 != 0) {
          pUVar15 = &this->list[iVar9].type;
          do {
            lVar3 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (U8)SVar12;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            iVar9 = iVar9 + 1;
            uVar14 = uVar14 & uVar14 - 1;
          } while (uVar14 != 0);
          this->last = iVar9;
        }
        SVar12 = pSVar8[1];
        pSVar8 = pSVar8 + 1;
      } while (SVar12 != no_square);
    }
    pSVar8 = this->bishops;
    if (*pSVar8 != no_square) {
      do {
        UVar5 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
        uVar6 = UVar5 & this->qtarget;
        if (uVar6 != 0) {
          SVar12 = *pSVar8;
          uVar14 = (ulong)this->last;
          pUVar15 = &this->list[uVar14].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar12;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar10 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar10;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar10;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar8 = this->rooks;
    if (*pSVar8 != no_square) {
      do {
        UVar5 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
        uVar6 = UVar5 & this->qtarget;
        if (uVar6 != 0) {
          SVar12 = *pSVar8;
          uVar14 = (ulong)this->last;
          pUVar15 = &this->list[uVar14].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar12;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar10 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar10;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar10;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar8 = this->queens;
    if (*pSVar8 != no_square) {
      do {
        UVar5 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
        UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
        uVar6 = (UVar7 | UVar5) & this->qtarget;
        if (uVar6 != 0) {
          SVar12 = *pSVar8;
          uVar14 = (ulong)this->last;
          pUVar15 = &this->list[uVar14].type;
          do {
            lVar3 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            ((Move *)(pUVar15 + -2))->f = (char)SVar12;
            pUVar15[-1] = (U8)lVar3;
            *pUVar15 = '\n';
            pUVar15 = pUVar15 + 3;
            uVar10 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar10;
            uVar6 = uVar6 & uVar6 - 1;
          } while (uVar6 != 0);
          this->last = uVar10;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    generate<(Movetype)10,(Piece)0>(this);
    uVar6 = this->empty & (&bitboards::kmask)[*this->kings];
    UVar4 = (U8)*this->kings;
    if (uVar6 != 0) {
      uVar14 = (ulong)this->last;
      pUVar15 = &this->list[uVar14].type;
      do {
        lVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar15 + -2))->f = UVar4;
        pUVar15[-1] = (U8)lVar3;
        *pUVar15 = '\n';
        pUVar15 = pUVar15 + 3;
        uVar10 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar10;
        uVar6 = uVar6 & uVar6 - 1;
      } while (uVar6 != 0);
      this->last = uVar10;
    }
    if (this->can_castle_ks == true) {
      iVar9 = this->last;
      this->last = iVar9 + 1;
      UVar13 = '>';
      if (this->us == white) {
        UVar13 = '\x06';
      }
      this->list[iVar9].f = UVar4;
      this->list[iVar9].t = UVar13;
      this->list[iVar9].type = '\b';
    }
    if (this->can_castle_qs == true) {
      iVar9 = this->last;
      this->last = iVar9 + 1;
      UVar13 = ':';
      if (this->us == white) {
        UVar13 = '\x02';
      }
      this->list[iVar9].f = UVar4;
      this->list[iVar9].t = UVar13;
      this->list[iVar9].type = '\t';
    }
  }
  else {
    if (this->evasion_target == 0) {
      SVar12 = *this->kings;
      uVar6 = this->empty & (&bitboards::kmask)[SVar12];
      if (uVar6 == 0) {
        return;
      }
      uVar14 = (ulong)this->last;
      pUVar15 = &this->list[uVar14].type;
      do {
        lVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar15 + -2))->f = (U8)SVar12;
        pUVar15[-1] = (U8)lVar3;
        *pUVar15 = '\n';
        pUVar15 = pUVar15 + 3;
        uVar10 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar10;
        uVar6 = uVar6 & uVar6 - 1;
      } while (uVar6 != 0);
    }
    else {
      if ((uVar6 & uVar6 - 1) == 0) {
        pSVar8 = this->knights;
        SVar12 = *pSVar8;
        if (SVar12 != no_square) {
          iVar9 = this->last;
          uVar6 = this->qtarget;
          do {
            uVar14 = (&bitboards::nmask)[SVar12] & uVar6;
            if (uVar14 != 0) {
              pUVar15 = &this->list[iVar9].type;
              do {
                lVar3 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (U8)SVar12;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                iVar9 = iVar9 + 1;
                uVar14 = uVar14 & uVar14 - 1;
              } while (uVar14 != 0);
              this->last = iVar9;
            }
            SVar12 = pSVar8[1];
            pSVar8 = pSVar8 + 1;
          } while (SVar12 != no_square);
        }
        pSVar8 = this->bishops;
        if (*pSVar8 != no_square) {
          do {
            UVar5 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            uVar6 = UVar5 & this->qtarget;
            if (uVar6 != 0) {
              SVar12 = *pSVar8;
              uVar14 = (ulong)this->last;
              pUVar15 = &this->list[uVar14].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar12;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                uVar10 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar10;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->rooks;
        if (*pSVar8 != no_square) {
          do {
            UVar5 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar6 = UVar5 & this->qtarget;
            if (uVar6 != 0) {
              SVar12 = *pSVar8;
              uVar14 = (ulong)this->last;
              pUVar15 = &this->list[uVar14].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar12;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                uVar10 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar10;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->queens;
        if (*pSVar8 != no_square) {
          do {
            UVar5 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar6 = (UVar7 | UVar5) & this->qtarget;
            if (uVar6 != 0) {
              SVar12 = *pSVar8;
              uVar14 = (ulong)this->last;
              pUVar15 = &this->list[uVar14].type;
              do {
                lVar3 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                  }
                }
                ((Move *)(pUVar15 + -2))->f = (char)SVar12;
                pUVar15[-1] = (U8)lVar3;
                *pUVar15 = '\n';
                pUVar15 = pUVar15 + 3;
                uVar10 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar10;
                uVar6 = uVar6 & uVar6 - 1;
              } while (uVar6 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        local_30 = 0;
        if (this->pawns7 != 0) {
          pcVar11 = anon_unknown.dwarf_96d6f::shift<(Dir)1>;
          if (this->us == white) {
            pcVar11 = anon_unknown.dwarf_96d6f::shift<(Dir)0>;
          }
          local_30 = this->pawns7;
          (*pcVar11)(&local_30);
          local_30 = local_30 & this->qtarget;
        }
        if (local_30 != 0) {
          CVar2 = this->us;
          uVar6 = (ulong)this->last;
          pUVar15 = &this->list[uVar6 + 3].type;
          do {
            lVar3 = 0;
            if (local_30 != 0) {
              for (; (local_30 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
              }
            }
            UVar4 = (U8)lVar3;
            UVar13 = (CVar2 != white) * '\x10' + -8 + UVar4;
            uVar10 = (int)uVar6 + 4;
            uVar6 = (ulong)uVar10;
            pUVar15[-0xb] = UVar13;
            pUVar15[-10] = UVar4;
            pUVar15[-9] = 0;
            pUVar15[-8] = UVar13;
            pUVar15[-7] = UVar4;
            pUVar15[-6] = 1;
            pUVar15[-5] = UVar13;
            pUVar15[-4] = UVar4;
            pUVar15[-3] = 2;
            ((Move *)(pUVar15 + -2))->f = UVar13;
            pUVar15[-1] = UVar4;
            *pUVar15 = '\x03';
            pUVar15 = pUVar15 + 0xc;
            local_30 = local_30 - 1 & local_30;
          } while (local_30 != 0);
          this->last = uVar10;
          local_30 = 0;
        }
        generate<(Movetype)10,(Piece)0>(this);
      }
      SVar12 = *this->kings;
      uVar6 = this->empty & (&bitboards::kmask)[SVar12];
      if (uVar6 == 0) {
        return;
      }
      uVar14 = (ulong)this->last;
      pUVar15 = &this->list[uVar14].type;
      do {
        lVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        ((Move *)(pUVar15 + -2))->f = (U8)SVar12;
        pUVar15[-1] = (U8)lVar3;
        *pUVar15 = '\n';
        pUVar15 = pUVar15 + 3;
        uVar10 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar10;
        uVar6 = uVar6 & uVar6 - 1;
      } while (uVar6 != 0);
    }
    this->last = uVar10;
  }
  return;
}

Assistant:

inline void Movegen::generate<quiet, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) {
		generate<promotion, pawn>();
		generate<quiet, knight>();
		generate<quiet, bishop>();
		generate<quiet, rook>();
		generate<quiet, queen>();
		generate<quiet, pawn>();
		generate<quiet, king>();
		generate<castles, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		generate<quiet, king>();
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<quiet, knight>();
			generate<quiet, bishop>();
			generate<quiet, rook>();
			generate<quiet, queen>();
			generate<promotion, pawn>();
			generate<quiet, pawn>();
		}
		generate<quiet, king>();
	}

}